

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChParticleCloud.cpp
# Opt level: O1

void __thiscall
chrono::ChParticleCloud::IntStateGatherAcceleration
          (ChParticleCloud *this,uint off_a,ChStateDelta *a)

{
  double *pdVar1;
  ChAparticle *pCVar2;
  pointer ppCVar3;
  Index index_1;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  double local_48 [3];
  
  ppCVar3 = (this->particles).
            super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->particles).
      super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppCVar3) {
    uVar5 = off_a + 3;
    uVar8 = 0;
    uVar7 = (ulong)off_a;
    do {
      uVar9 = off_a + (int)uVar8 * 6;
      if ((a->super_ChVectorDynamic<double>).
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows + -3 <
          (long)(ulong)uVar9) {
LAB_00537b71:
        __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                      ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                      "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                     );
      }
      pdVar1 = (a->super_ChVectorDynamic<double>).
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
      uVar4 = 3;
      if ((((ulong)(pdVar1 + uVar9) & 7) == 0) &&
         (uVar4 = (ulong)(-((uint)((ulong)(pdVar1 + uVar9) >> 3) & 0x1fffffff) & 7), 2 < uVar4)) {
        uVar4 = 3;
      }
      pCVar2 = ppCVar3[uVar8];
      if (uVar4 != 0) {
        uVar6 = 0;
        do {
          pdVar1[uVar7 + uVar6] =
               (pCVar2->super_ChParticleBase).super_ChFrameMoving<double>.coord_dtdt.pos.m_data
               [uVar6];
          uVar6 = uVar6 + 1;
        } while (uVar4 != uVar6);
      }
      if (uVar4 < 3) {
        do {
          pdVar1[uVar7 + uVar4] =
               (pCVar2->super_ChParticleBase).super_ChFrameMoving<double>.coord_dtdt.pos.m_data
               [uVar4];
          uVar4 = uVar4 + 1;
        } while (uVar4 != 3);
      }
      ChFrameMoving<double>::GetWacc_loc
                ((ChFrameMoving<double> *)
                 (this->particles).
                 super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar8]);
      if ((a->super_ChVectorDynamic<double>).
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows + -3 <
          (long)(ulong)(uVar9 + 3)) goto LAB_00537b71;
      pdVar1 = (a->super_ChVectorDynamic<double>).
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
      uVar4 = 3;
      if ((((ulong)(pdVar1 + (uVar9 + 3)) & 7) == 0) &&
         (uVar4 = (ulong)(-((uint)((ulong)(pdVar1 + (uVar9 + 3)) >> 3) & 0x1fffffff) & 7), 2 < uVar4
         )) {
        uVar4 = 3;
      }
      if (uVar4 != 0) {
        uVar6 = 0;
        do {
          pdVar1[uVar5 + uVar6] = local_48[uVar6];
          uVar6 = uVar6 + 1;
        } while (uVar4 != uVar6);
      }
      if (uVar4 < 3) {
        do {
          pdVar1[uVar5 + uVar4] = local_48[uVar4];
          uVar4 = uVar4 + 1;
        } while (uVar4 != 3);
      }
      uVar8 = (ulong)((int)uVar8 + 1);
      ppCVar3 = (this->particles).
                super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      uVar7 = (ulong)((int)uVar7 + 6);
      uVar5 = uVar5 + 6;
    } while (uVar8 < (ulong)((long)(this->particles).
                                   super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar3 >> 3))
    ;
  }
  return;
}

Assistant:

void ChParticleCloud::IntStateGatherAcceleration(const unsigned int off_a, ChStateDelta& a) {
    for (unsigned int j = 0; j < particles.size(); j++) {
        a.segment(off_a + 6 * j + 0, 3) = particles[j]->coord_dtdt.pos.eigen();
        a.segment(off_a + 6 * j + 3, 3) = particles[j]->GetWacc_loc().eigen();
    }
}